

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

UnicodeSet *
icu_63::number::impl::CurrencySpacingEnabledModifier::getUnicodeSet
          (UnicodeSet *__return_storage_ptr__,DecimalFormatSymbols *symbols,EPosition position,
          EAffix affix,UErrorCode *status)

{
  UBool UVar1;
  int8_t iVar2;
  UnicodeString *pUVar3;
  ConstChar16Ptr local_50 [3];
  ConstChar16Ptr local_38;
  UnicodeString *local_30;
  UnicodeString *pattern;
  UErrorCode *status_local;
  EAffix affix_local;
  EPosition position_local;
  DecimalFormatSymbols *symbols_local;
  
  pattern = (UnicodeString *)status;
  status_local._0_4_ = affix;
  status_local._4_4_ = position;
  _affix_local = symbols;
  symbols_local = (DecimalFormatSymbols *)__return_storage_ptr__;
  umtx_initOnce((UInitOnce *)&::(anonymous_namespace)::gDefaultCurrencySpacingInitOnce,
                anon_unknown.dwarf_145761::initDefaultCurrencySpacing,status);
  UVar1 = ::U_FAILURE(*(UErrorCode *)&(pattern->super_Replaceable).super_UObject._vptr_UObject);
  if (UVar1 == '\0') {
    pUVar3 = DecimalFormatSymbols::getPatternForCurrencySpacing
                       (_affix_local,(uint)(status_local._4_4_ != IN_CURRENCY),
                        (EAffix)status_local == SUFFIX,(UErrorCode *)pattern);
    local_30 = pUVar3;
    ConstChar16Ptr::ConstChar16Ptr(&local_38,L"[:digit:]");
    iVar2 = UnicodeString::compare(pUVar3,&local_38,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_38);
    pUVar3 = local_30;
    if (iVar2 == '\0') {
      UnicodeSet::UnicodeSet(__return_storage_ptr__,::(anonymous_namespace)::UNISET_DIGIT);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(local_50,L"[:^S:]");
      iVar2 = UnicodeString::compare(pUVar3,local_50,-1);
      ConstChar16Ptr::~ConstChar16Ptr(local_50);
      if (iVar2 == '\0') {
        UnicodeSet::UnicodeSet(__return_storage_ptr__,::(anonymous_namespace)::UNISET_NOTS);
      }
      else {
        UnicodeSet::UnicodeSet(__return_storage_ptr__,local_30,(UErrorCode *)pattern);
      }
    }
  }
  else {
    UnicodeSet::UnicodeSet(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeSet
CurrencySpacingEnabledModifier::getUnicodeSet(const DecimalFormatSymbols &symbols, EPosition position,
                                              EAffix affix, UErrorCode &status) {
    // Ensure the static defaults are initialized:
    umtx_initOnce(gDefaultCurrencySpacingInitOnce, &initDefaultCurrencySpacing, status);
    if (U_FAILURE(status)) {
        return UnicodeSet();
    }

    const UnicodeString& pattern = symbols.getPatternForCurrencySpacing(
            position == IN_CURRENCY ? UNUM_CURRENCY_MATCH : UNUM_CURRENCY_SURROUNDING_MATCH,
            affix == SUFFIX,
            status);
    if (pattern.compare(u"[:digit:]", -1) == 0) {
        return *UNISET_DIGIT;
    } else if (pattern.compare(u"[:^S:]", -1) == 0) {
        return *UNISET_NOTS;
    } else {
        return UnicodeSet(pattern, status);
    }
}